

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::PrintFieldValueToString
          (Printer *this,Message *message,FieldDescriptor *field,int index,string *output)

{
  Reflection *this_00;
  TextGenerator generator;
  StringOutputStream output_stream;
  TextGenerator *in_stack_00000158;
  int in_stack_00000164;
  FieldDescriptor *in_stack_00000168;
  Reflection *in_stack_00000170;
  Message *in_stack_00000178;
  Printer *in_stack_00000180;
  string *in_stack_ffffffffffffff18;
  StringOutputStream *in_stack_ffffffffffffff20;
  ZeroCopyOutputStream *output_00;
  TextGenerator *in_stack_ffffffffffffff30;
  ZeroCopyOutputStream local_88 [17];
  
  std::__cxx11::string::clear();
  output_00 = local_88;
  io::StringOutputStream::StringOutputStream(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  TextGenerator::TextGenerator
            (in_stack_ffffffffffffff30,output_00,(int)((ulong)in_stack_ffffffffffffff20 >> 0x20));
  this_00 = Message::GetReflection((Message *)in_stack_ffffffffffffff20);
  PrintFieldValue(in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168,
                  in_stack_00000164,in_stack_00000158);
  TextGenerator::~TextGenerator((TextGenerator *)this_00);
  io::StringOutputStream::~StringOutputStream((StringOutputStream *)0x4367e8);
  return;
}

Assistant:

void TextFormat::Printer::PrintFieldValueToString(const Message& message,
                                                  const FieldDescriptor* field,
                                                  int index,
                                                  std::string* output) const {
  GOOGLE_DCHECK(output) << "output specified is nullptr";

  output->clear();
  io::StringOutputStream output_stream(output);
  TextGenerator generator(&output_stream, initial_indent_level_);

  PrintFieldValue(message, message.GetReflection(), field, index, &generator);
}